

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,Bridges *bridges)

{
  bool bVar1;
  reference e_00;
  ostream *poVar2;
  LightEdge *e;
  const_iterator __end1;
  const_iterator __begin1;
  Bridges *__range1;
  Bridges *bridges_local;
  ostream *stream_local;
  
  __end1 = std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::begin(bridges);
  e = (LightEdge *)std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::end(bridges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Graph::LightEdge_*,_std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>
                                *)&e);
    if (!bVar1) break;
    e_00 = __gnu_cxx::
           __normal_iterator<const_Graph::LightEdge_*,_std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>
           ::operator*(&__end1);
    poVar2 = operator<<(stream,e_00);
    std::operator<<(poVar2," ");
    __gnu_cxx::
    __normal_iterator<const_Graph::LightEdge_*,_std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>
    ::operator++(&__end1);
  }
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Graph::Bridges &bridges) {
    for (auto &e : bridges)
        stream << e << " ";
    return stream;
}